

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module_ * __thiscall
pybind11::module_::
def<py_init_module_imgui_funcs(pybind11::module_&)::__19,char[1],pybind11::arg,pybind11::arg_v>
          (module_ *this,char *name_,type *f,char (*extra) [1],arg *extra_1,arg_v *extra_2)

{
  handle local_78;
  PyObject *local_70;
  handle local_68;
  handle local_60;
  sibling local_58;
  scope local_50;
  name local_48;
  handle local_40;
  cpp_function func;
  arg_v *extra_local_2;
  arg *extra_local_1;
  char (*extra_local) [1];
  type *f_local;
  char *name__local;
  module_ *this_local;
  
  func.super_function.super_object.super_handle.m_ptr = (function)(function)extra_2;
  pybind11::name::name(&local_48,name_);
  pybind11::scope::scope(&local_50,(handle *)this);
  local_68.m_ptr = (this->super_object).super_handle.m_ptr;
  none::none((none *)&local_78);
  local_70 = local_78.m_ptr;
  getattr((pybind11 *)&local_60,local_68,name_,local_78);
  sibling::sibling(&local_58,&local_60);
  cpp_function::
  cpp_function<py_init_module_imgui_funcs(pybind11::module_&)::__19,pybind11::name,pybind11::scope,pybind11::sibling,char[1],pybind11::arg,pybind11::arg_v,void>
            ((cpp_function *)&local_40,f,&local_48,&local_50,&local_58,extra,extra_1,
             (arg_v *)func.super_function.super_object.super_handle.m_ptr);
  object::~object((object *)&local_60);
  none::~none((none *)&local_78);
  add_object(this,name_,local_40,true);
  cpp_function::~cpp_function((cpp_function *)&local_40);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }